

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatareader.cpp
# Opt level: O0

UBool icu_63::CollationDataReader::isAcceptable
                (void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  UVersionInfo *version;
  UDataInfo *pInfo_local;
  char *param_2_local;
  char *param_1_local;
  void *context_local;
  
  if (((((pInfo->size < 0x14) || (pInfo->isBigEndian != '\0')) || (pInfo->charsetFamily != '\0')) ||
      ((pInfo->dataFormat[0] != 'U' || (pInfo->dataFormat[1] != 'C')))) ||
     ((pInfo->dataFormat[2] != 'o' ||
      ((pInfo->dataFormat[3] != 'l' || (pInfo->formatVersion[0] != '\x05')))))) {
    context_local._7_1_ = '\0';
  }
  else {
    if (context != (void *)0x0) {
      *(undefined4 *)context = *(undefined4 *)pInfo->dataVersion;
    }
    context_local._7_1_ = '\x01';
  }
  return context_local._7_1_;
}

Assistant:

UBool U_CALLCONV
CollationDataReader::isAcceptable(void *context,
                                  const char * /* type */, const char * /*name*/,
                                  const UDataInfo *pInfo) {
    if(
        pInfo->size >= 20 &&
        pInfo->isBigEndian == U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily == U_CHARSET_FAMILY &&
        pInfo->dataFormat[0] == 0x55 &&  // dataFormat="UCol"
        pInfo->dataFormat[1] == 0x43 &&
        pInfo->dataFormat[2] == 0x6f &&
        pInfo->dataFormat[3] == 0x6c &&
        pInfo->formatVersion[0] == 5
    ) {
        UVersionInfo *version = static_cast<UVersionInfo *>(context);
        if(version != NULL) {
            uprv_memcpy(version, pInfo->dataVersion, 4);
        }
        return TRUE;
    } else {
        return FALSE;
    }
}